

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  Parse *pParse;
  ExprList *pEVar1;
  SrcList *pSVar2;
  Expr *pExpr;
  int iVar3;
  char **ppcVar4;
  int ii;
  long lVar5;
  long lVar6;
  anon_union_8_2_443a03b8_for_u *paVar7;
  
  pParse = pWalker->pParse;
  if (pParse->nErr == 0) {
    if ((p->selFlags & 0x4200000) == 0) {
      pEVar1 = p->pEList;
      if (pEVar1 != (ExprList *)0x0) {
        ppcVar4 = &pEVar1->a[0].zEName;
        for (lVar5 = 0; lVar5 < pEVar1->nExpr; lVar5 = lVar5 + 1) {
          if ((*ppcVar4 != (char *)0x0) && ((*(byte *)((long)ppcVar4 + 9) & 3) == 0)) {
            sqlite3RenameTokenRemap(pParse,(void *)0x0,*ppcVar4);
          }
          ppcVar4 = ppcVar4 + 3;
        }
      }
      pSVar2 = p->pSrc;
      if (pSVar2 != (SrcList *)0x0) {
        for (lVar5 = 0; lVar5 < pSVar2->nSrc; lVar5 = lVar5 + 1) {
          sqlite3RenameTokenRemap(pParse,(void *)0x0,pSVar2->a[lVar5].zName);
          pExpr = (Expr *)pSVar2->a[lVar5].u3.pUsing;
          if ((pSVar2->a[lVar5].fg.field_0x2 & 4) == 0) {
            sqlite3WalkExpr(pWalker,pExpr);
          }
          else {
            paVar7 = &pExpr->u;
            for (lVar6 = 0; iVar3._0_1_ = pExpr->op, iVar3._1_1_ = pExpr->affExpr,
                iVar3._2_1_ = pExpr->op2, iVar3._3_1_ = pExpr->field_0x3, lVar6 < iVar3;
                lVar6 = lVar6 + 1) {
              sqlite3RenameTokenRemap(pParse,(void *)0x0,paVar7->zToken);
              paVar7 = paVar7 + 2;
            }
          }
        }
      }
      renameWalkWith(pWalker,p);
      iVar3 = 0;
    }
    else {
      iVar3 = 1;
    }
  }
  else {
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( pParse->nErr ) return WRC_Abort;
  testcase( p->selFlags & SF_View );
  testcase( p->selFlags & SF_CopyCte );
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    return WRC_Prune;
  }
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zEName && pList->a[i].fg.eEName==ENAME_NAME ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zEName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
      if( pSrc->a[i].fg.isUsing==0 ){
        sqlite3WalkExpr(pWalker, pSrc->a[i].u3.pOn);
      }else{
        unmapColumnIdlistNames(pParse, pSrc->a[i].u3.pUsing);
      }
    }
  }

  renameWalkWith(pWalker, p);
  return WRC_Continue;
}